

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automations.cpp
# Opt level: O0

void __thiscall rtosc::AutomationMgr::updateMapping(AutomationMgr *this,int slot_id,int sub)

{
  Automation *pAVar1;
  float fVar2;
  float fVar3;
  float range;
  float center;
  float mx;
  float mn;
  Automation *au;
  int sub_local;
  int slot_id_local;
  AutomationMgr *this_local;
  
  if ((((slot_id < this->nslots) && (-1 < slot_id)) && (sub < this->per_slot)) && (-1 < sub)) {
    pAVar1 = this->slots[slot_id].automations;
    fVar2 = (pAVar1[sub].param_min + pAVar1[sub].param_max) * (pAVar1[sub].map.offset / 100.0 + 0.5)
    ;
    fVar3 = ((pAVar1[sub].param_max - pAVar1[sub].param_min) * pAVar1[sub].map.gain) / 100.0;
    pAVar1[sub].map.upoints = 2;
    *pAVar1[sub].map.control_points = 0.0;
    pAVar1[sub].map.control_points[1] = fVar2 - fVar3 / 2.0;
    pAVar1[sub].map.control_points[2] = 1.0;
    pAVar1[sub].map.control_points[3] = fVar2 + fVar3 / 2.0;
  }
  return;
}

Assistant:

void AutomationMgr::updateMapping(int slot_id, int sub)
{
    if(slot_id >= nslots || slot_id < 0 || sub >= per_slot || sub < 0)
        return;


    auto &au = slots[slot_id].automations[sub];

    float mn = au.param_min;
    float mx = au.param_max;
    float center = (mn+mx)*(0.5 + au.map.offset/100.0);
    float range  = (mx-mn)*au.map.gain/100.0;

    au.map.upoints = 2;
    au.map.control_points[0] = 0;
    au.map.control_points[1] = center-range/2.0;
    au.map.control_points[2] = 1;
    au.map.control_points[3] = center+range/2.0;
}